

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glob.cpp
# Opt level: O0

pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* glob::anon_unknown_2::split_path
            (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *__return_storage_ptr__,string *path)

{
  pair<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_e0;
  allocator<char> local_b1;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b0;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a8;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a0;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  allocator<char> local_59;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  long local_20;
  size_type last_sep;
  string *path_local;
  
  last_sep = (size_type)path;
  path_local = &__return_storage_ptr__->first;
  local_20 = std::__cxx11::string::find_last_of((char *)path,0x5e2420);
  if (local_20 == -1) {
    std::make_pair<char_const(&)[2],std::__cxx11::string_const&>
              (&local_e0,(char (*) [2])0x5e3b04,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)last_sep);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              (__return_storage_ptr__,&local_e0);
    std::
    pair<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair(&local_e0);
  }
  else {
    local_48._M_current = (char *)std::__cxx11::string::begin();
    local_58._M_current = (char *)std::__cxx11::string::begin();
    local_50 = __gnu_cxx::
               __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator+(&local_58,local_20);
    std::allocator<char>::allocator();
    std::__cxx11::string::
    string<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
              ((string *)&local_40,local_48,local_50,&local_59);
    local_a8._M_current = (char *)std::__cxx11::string::begin();
    local_a0 = __gnu_cxx::
               __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator+(&local_a8,local_20);
    local_98 = __gnu_cxx::
               __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator+(&local_a0,1);
    local_b0._M_current = (char *)std::__cxx11::string::end();
    std::allocator<char>::allocator();
    std::__cxx11::string::
    string<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
              ((string *)&local_90,local_98,local_b0,&local_b1);
    std::make_pair<std::__cxx11::string,std::__cxx11::string>
              (__return_storage_ptr__,&local_40,&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    std::allocator<char>::~allocator(&local_b1);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_59);
  }
  return __return_storage_ptr__;
}

Assistant:

std::pair<std::string, std::string> split_path(const std::string &path) {
    std::string::size_type last_sep = path.find_last_of("/");
    if (last_sep != std::string::npos) {
        return std::make_pair(
            std::string(path.begin(), path.begin() + last_sep),
            std::string(path.begin() + last_sep + 1, path.end()));
    }
    return std::make_pair(".", path);
}